

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::growPattern(PatternModel *this)

{
  int *piVar1;
  GrowCmd *this_00;
  QUndoStack *pQVar2;
  Iterator local_30;
  
  if (this->mHasSelection != false) {
    PatternSelection::iterator(&local_30,&this->mSelection);
    if (2 < (local_30.mEnd.super_PatternCursorBase.row - local_30.mStart.super_PatternCursorBase.row
            ) + 1) {
      this_00 = (GrowCmd *)operator_new(0x40);
      GrowCmd::GrowCmd(this_00,this);
      QMetaObject::tr((char *)&local_30,(char *)&staticMetaObject,0x1b5fcb);
      QUndoCommand::setText((QString *)this_00);
      piVar1 = (int *)CONCAT44(local_30.mStart.super_PatternCursorBase.column,
                               local_30.mStart.super_PatternCursorBase.row);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT44(local_30.mStart.super_PatternCursorBase.column,
                              local_30.mStart.super_PatternCursorBase.row),2,8);
        }
      }
      pQVar2 = Module::undoStack(this->mModule);
      QUndoStack::push((QUndoCommand *)pQVar2);
    }
  }
  return;
}

Assistant:

bool PatternModel::canGrowOrShrink() const {
    return mHasSelection && mSelection.iterator().rows() > 2;
}